

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntCooperativeMatrixType
          (ValidationState_t *this,uint32_t id)

{
  unordered_map<unsigned_int,_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>_>
  *this_00;
  bool bVar1;
  const_iterator cVar2;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t local_1c;
  
  this_00 = &this->all_definitions_;
  local_24 = id;
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_24);
  if ((((cVar2.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (*(long *)((long)cVar2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                        ._M_cur + 0x10) == 0)) ||
      (*(short *)(*(long *)((long)cVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                  ._M_cur + 0x10) + 0x3a) != 0x14ee)) &&
     (((local_20 = id,
       cVar2 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&this_00->_M_h,&local_20),
       cVar2.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur == (__node_type *)0x0 ||
       (*(long *)((long)cVar2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                        ._M_cur + 0x10) == 0)) ||
      (*(short *)(*(long *)((long)cVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                  ._M_cur + 0x10) + 0x3a) != 0x1168)))) {
    return false;
  }
  local_1c = id;
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_1c);
  bVar1 = IsUnsignedIntScalarType
                    (this,*(uint32_t *)
                           (**(long **)((long)cVar2.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                              ._M_cur + 0x10) + 8));
  return bVar1;
}

Assistant:

bool ValidationState_t::IsUnsignedIntCooperativeMatrixType(uint32_t id) const {
  if (!IsCooperativeMatrixNVType(id) && !IsCooperativeMatrixKHRType(id))
    return false;
  return IsUnsignedIntScalarType(FindDef(id)->word(2));
}